

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::EventsProcessorTests_trySelectNextStockPileCardOnLeftButtonDownEvent_Test::
TestBody(EventsProcessorTests_trySelectNextStockPileCardOnLeftButtonDownEvent_Test *this)

{
  Quit local_29;
  Event local_28;
  Event local_1c;
  EventsProcessorTests_trySelectNextStockPileCardOnLeftButtonDownEvent_Test *local_10;
  EventsProcessorTests_trySelectNextStockPileCardOnLeftButtonDownEvent_Test *this_local;
  
  local_10 = this;
  std::
  variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
  ::
  variant<solitaire::events::MouseLeftButtonDown_const&,void,void,solitaire::events::MouseLeftButtonDown,void>
            ((variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
              *)&local_1c,(MouseLeftButtonDown *)&(anonymous_namespace)::mouseLeftButtonDownEvent);
  EventsProcessorTests::expectEvent(&this->super_EventsProcessorTests,&local_1c);
  EventsProcessorTests::ignoreLeftButtonDownOnButtons(&this->super_EventsProcessorTests);
  EventsProcessorTests::ignoreLeftButtonDownOnFoundationPilesFromFirstTo
            (&this->super_EventsProcessorTests,4);
  EventsProcessorTests::ignoreLeftButtonDownOnTableauPilesFromFirstTo
            (&this->super_EventsProcessorTests,7);
  EventsProcessorTests::expectGetStockPileCollider(&this->super_EventsProcessorTests);
  EventsProcessorTests::acceptLeftButtonDownOnCoveredStockPileCards
            (&this->super_EventsProcessorTests,
             (MouseLeftButtonDown *)&(anonymous_namespace)::mouseLeftButtonDownEvent);
  std::
  variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
  ::variant<solitaire::events::Quit,void,void,solitaire::events::Quit,void>
            ((variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
              *)&local_28,&local_29);
  EventsProcessorTests::expectEvent(&this->super_EventsProcessorTests,&local_28);
  EventsProcessor::processEvents(&(this->super_EventsProcessorTests).eventsProcessor);
  return;
}

Assistant:

TEST_F(EventsProcessorTests,
       trySelectNextStockPileCardOnLeftButtonDownEvent)
{
    expectEvent(mouseLeftButtonDownEvent);
    ignoreLeftButtonDownOnButtons();
    ignoreLeftButtonDownOnFoundationPilesFromFirstTo(foundationPilesCount);
    ignoreLeftButtonDownOnTableauPilesFromFirstTo(tableauPilesCount);
    expectGetStockPileCollider();
    acceptLeftButtonDownOnCoveredStockPileCards(mouseLeftButtonDownEvent);
    expectEvent(Quit {});
    eventsProcessor.processEvents();
}